

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtimer.cpp
# Opt level: O1

void QTimer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QUntypedPropertyData *data;
  int *piVar1;
  QObjectData *pQVar2;
  QBindingStatus *pQVar3;
  parameter_type *ppVar4;
  undefined1 uVar5;
  int iVar6;
  QBindableInterface *pQVar7;
  long *plVar8;
  long in_FS_OFFSET;
  undefined1 local_49;
  void *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_48 = (void *)0x0;
      puStack_40 = &local_49;
      QMetaObject::activate(_o,&staticMetaObject,0,&local_48);
      break;
    case 1:
      start((QTimer *)_o,(milliseconds)(long)*_a[1]);
      break;
    case 2:
      start((QTimer *)_o);
      break;
    case 3:
      stop((QTimer *)_o);
    }
    switch(_c) {
    case ReadProperty:
      goto switchD_002ce662_caseD_1;
    case WriteProperty:
      goto switchD_002ce662_caseD_2;
    default:
      goto switchD_002ce662_caseD_3;
    case IndexOfMethod:
      goto switchD_002ce662_caseD_5;
    case BindableProperty:
      break;
    }
  case ReadProperty:
switchD_002ce662_caseD_1:
    if (4 < (uint)_id) goto LAB_002ce7d3;
    piVar1 = (int *)*_a;
    switch(_id) {
    case 0:
      pQVar2 = (_o->d_ptr).d;
      pQVar3 = (pQVar2->bindingStorage).bindingStatus;
      if ((pQVar3 != (QBindingStatus *)0x0) &&
         (pQVar3->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
        QBindingStorage::registerDependency_helper
                  (&pQVar2->bindingStorage,(QUntypedPropertyData *)&pQVar2[1].metaObject);
      }
      uVar5 = *(undefined1 *)&pQVar2[1].metaObject;
      goto LAB_002ce786;
    case 1:
      iVar6 = QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
              ::value((QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>
                       *)((long)&(_o->d_ptr).d[1].children.d.size + 4));
      break;
    case 2:
      iVar6 = remainingTime((QTimer *)_o);
      break;
    case 3:
      pQVar2 = (_o->d_ptr).d;
      data = (QUntypedPropertyData *)((long)&pQVar2[1].metaObject + 4);
      pQVar3 = (pQVar2->bindingStorage).bindingStatus;
      if ((pQVar3 != (QBindingStatus *)0x0) &&
         (pQVar3->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
        QBindingStorage::registerDependency_helper(&pQVar2->bindingStorage,data);
      }
      iVar6 = *(int *)data;
      break;
    case 4:
      uVar5 = isActive((QTimer *)_o);
LAB_002ce786:
      *(undefined1 *)piVar1 = uVar5;
      goto LAB_002ce7d3;
    }
    *piVar1 = iVar6;
LAB_002ce7d3:
    if (_c != BindableProperty) {
      if (_c != WriteProperty) goto switchD_002ce662_caseD_3;
switchD_002ce662_caseD_2:
      ppVar4 = (parameter_type *)*_a;
      if (_id == 3) {
        QObjectBindableProperty<QTimerPrivate,_Qt::TimerType,_&QTimerPrivate::_qt_property_type_offset,_nullptr>
        ::setValue((QObjectBindableProperty<QTimerPrivate,_Qt::TimerType,_&QTimerPrivate::_qt_property_type_offset,_nullptr>
                    *)((long)&(_o->d_ptr).d[1].metaObject + 4),*ppVar4);
      }
      else if (_id == 1) {
        setInterval((QTimer *)_o,(milliseconds)(long)(int)*ppVar4);
      }
      else if (_id == 0) {
        QObjectBindableProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_single_offset,_nullptr>
        ::setValue((QObjectBindableProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_single_offset,_nullptr>
                    *)&(_o->d_ptr).d[1].metaObject,SUB41(*ppVar4,0));
      }
      if (_c != BindableProperty) goto switchD_002ce662_caseD_3;
    }
    break;
  case WriteProperty:
    goto switchD_002ce662_caseD_2;
  default:
    goto switchD_002ce662_caseD_3;
  case IndexOfMethod:
switchD_002ce662_caseD_5:
    if ((*_a[1] == timeout) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_002ce662_caseD_3;
    }
    if (_c != BindableProperty) {
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_002ce662_caseD_3;
        goto switchD_002ce662_caseD_1;
      }
      goto switchD_002ce662_caseD_2;
    }
    break;
  case BindableProperty:
    break;
  }
  switch(_id) {
  case 0:
    plVar8 = (long *)*_a;
    *plVar8 = (long)&(_o->d_ptr).d[1].metaObject;
    pQVar7 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectBindableProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_single_offset,_nullptr>,_void>
              ::iface;
    break;
  case 1:
    plVar8 = (long *)*_a;
    *plVar8 = (long)((long)&(_o->d_ptr).d[1].children.d.size + 4);
    pQVar7 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectCompatProperty<QTimerPrivate,_int,_&QTimerPrivate::_qt_property_inter_offset,_&QTimerPrivate::setInterval,_nullptr,_nullptr>,_void>
              ::iface;
    break;
  default:
    goto switchD_002ce662_caseD_3;
  case 3:
    plVar8 = (long *)*_a;
    *plVar8 = (long)((long)&(_o->d_ptr).d[1].metaObject + 4);
    pQVar7 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectBindableProperty<QTimerPrivate,_Qt::TimerType,_&QTimerPrivate::_qt_property_type_offset,_nullptr>,_void>
              ::iface;
    break;
  case 4:
    plVar8 = (long *)*_a;
    *plVar8 = (long)&(_o->d_ptr).d[1].bindingStorage;
    pQVar7 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectComputedProperty<QTimerPrivate,_bool,_&QTimerPrivate::_qt_property_isActiveData_offset,_&QTimerPrivate::isActive>,_void>
              ::iface;
  }
  plVar8[1] = (long)pQVar7;
switchD_002ce662_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTimer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTimer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->timeout(QPrivateSignal()); break;
        case 1: _t->start((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->start(); break;
        case 3: _t->stop(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTimer::*)(QPrivateSignal)>(_a, &QTimer::timeout, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isSingleShot(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->interval(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->remainingTime(); break;
        case 3: *reinterpret_cast<Qt::TimerType*>(_v) = _t->timerType(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->isActive(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSingleShot(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setInterval(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setTimerType(*reinterpret_cast<Qt::TimerType*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableSingleShot(); break;
        case 1: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableInterval(); break;
        case 3: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableTimerType(); break;
        case 4: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableActive(); break;
        default: break;
        }
    }
}